

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rollercoster.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  istream *piVar2;
  ostream *poVar3;
  bool bVar4;
  int i;
  ulong uVar5;
  bool up;
  string line;
  ifstream stream;
  
  std::ifstream::ifstream((istream *)&stream,argv[1],_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&stream,(string *)&line);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    up = true;
    bVar4 = true;
    for (uVar5 = 0; uVar5 < line._M_string_length; uVar5 = uVar5 + 1) {
      bVar1 = convert(line._M_dataplus._M_p + uVar5,&up);
      if (bVar1) {
        bVar4 = (bool)(bVar4 ^ 1);
        up = bVar4;
      }
    }
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&line);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&stream);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    ifstream stream(argv[1]);

    string line;
    bool up;
    while (getline(stream, line)) {
        up = true;

        for(int i = 0; i < line.size(); i++){
            bool tmp = convert(line[i],up);
            if(tmp)
                up = !up;

        }
        std::cout << line << std::endl;
    }
    return 0;
}